

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void setAnnealingPermute(void)

{
  int iVar1;
  int iVar2;
  int p1_00;
  double power;
  double gain;
  double temperature;
  int t;
  int p2;
  int p1;
  int i;
  double local_18;
  int in_stack_fffffffffffffff0;
  int local_4;
  
  for (local_4 = 1; local_4 <= numOfVariables; local_4 = local_4 + 1) {
    permute[local_4] = local_4;
    unpermute[local_4] = local_4;
  }
  uperm1 = idpermute;
  perm1 = idpermute;
  perm2 = permute;
  uperm2 = unpermute;
  for (local_18 = 20.0; 0.2 < local_18; local_18 = local_18 * 0.997) {
    for (local_4 = 1; local_4 <= numOfVariables * 4; local_4 = local_4 + 1) {
      iVar1 = myrand();
      iVar2 = iVar1 % numOfVariables + 1;
      iVar1 = myrand();
      p1_00 = iVar1 % numOfVariables + 1;
      power = swapGain(p1_00,in_stack_fffffffffffffff0);
      iVar1 = beatProbability(power);
      if (iVar1 != 0) {
        in_stack_fffffffffffffff0 = permute[iVar2];
        permute[iVar2] = permute[p1_00];
        permute[p1_00] = in_stack_fffffffffffffff0;
        unpermute[permute[iVar2]] = iVar2;
        unpermute[permute[p1_00]] = p1_00;
      }
    }
  }
  return;
}

Assistant:

void setAnnealingPermute ()
{
    int i, p1, p2, t;
    double temperature;
    double gain;

    for (i=1;i<=numOfVariables;i++)
    {
        permute[i] = i;
        unpermute[i] = i;
    }
    uperm1 = idpermute;
    perm1 = idpermute;
    perm2 = permute;
    uperm2 = unpermute;

    temperature = 20;

    while (temperature > 0.2)
    {
        for (i=1;i<=4*numOfVariables;i++)
        {
            p1 = 1 + myrand() % numOfVariables;
            p2 = 1 + myrand() % numOfVariables;
            gain = swapGain (p1, p2);
            if (beatProbability (gain/temperature))
            {
                t = permute[p1];
                permute[p1] = permute[p2];
                permute[p2] = t;
                unpermute[permute[p1]] = p1;
                unpermute[permute[p2]] = p2;

            }
       }
        temperature *= 0.997;
     }

}